

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
__thiscall cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  size_t sVar1;
  char *in_RDX;
  char *__s;
  long *local_48 [2];
  long local_38 [2];
  
  __s = "";
  if (in_RDX != (char *)0x0) {
    __s = in_RDX;
  }
  local_48[0] = local_38;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,__s + sVar1);
  Parse(this,(string *)input);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}